

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-vec.c
# Opt level: O2

TCGv_vec tcg_const_zeros_vec_aarch64(TCGContext_conflict1 *tcg_ctx,TCGType type)

{
  TCGv_vec r;
  TCGArg in_RCX;
  
  r = tcg_temp_new_vec_aarch64(tcg_ctx,type);
  do_dupi_vec(tcg_ctx,r,0,in_RCX);
  return r;
}

Assistant:

TCGv_vec tcg_const_zeros_vec(TCGContext *tcg_ctx, TCGType type)
{
    TCGv_vec ret = tcg_temp_new_vec(tcg_ctx, type);
    do_dupi_vec(tcg_ctx, ret, MO_REG, 0);
    return ret;
}